

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_fchang_2003.h
# Opt level: O1

void __thiscall CT::AllScans(CT *this)

{
  uint *puVar1;
  char cVar2;
  Mat1i *pMVar3;
  ulong uVar4;
  uint uVar5;
  Mat1b *pMVar6;
  bool b_external;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar3->field_0x10,0,*(long *)&pMVar3->field_0x20 - *(long *)&pMVar3->field_0x18
        );
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = 0;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  if (0 < *(int *)&pMVar6->field_0x8) {
    lVar9 = 0;
    do {
      uVar5 = *(uint *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
      uVar4 = (ulong)uVar5;
      if (0 < (int)uVar5) {
        pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar7 = **(long **)&pMVar3->field_0x48 * lVar9 + *(long *)&pMVar3->field_0x10;
        lVar8 = **(long **)&pMVar6->field_0x48 * lVar9 + *(long *)&pMVar6->field_0x10;
        lVar10 = 0;
        do {
          cVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74;
          if (*(char *)(lVar8 + lVar10) == cVar2) {
            uVar5 = *(uint *)(lVar7 + lVar10 * 4);
            if ((uVar5 == 0) && ((lVar10 == 0 || (*(char *)(lVar8 + -1 + lVar10) != cVar2)))) {
              uVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ + 1;
              (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar5;
              b_external = true;
            }
            else {
              if ((((int)uVar4 + -1 <= lVar10) || (*(char *)(lVar8 + 1 + lVar10) == cVar2)) ||
                 (*(int *)(lVar7 + 4 + lVar10 * 4) == -1)) {
                if (uVar5 == 0) {
                  *(undefined4 *)(lVar7 + lVar10 * 4) = *(undefined4 *)(lVar7 + -4 + lVar10 * 4);
                }
                goto LAB_001824b5;
              }
              if (uVar5 == 0) {
                uVar5 = *(uint *)(lVar7 + -4 + lVar10 * 4);
              }
              b_external = false;
            }
            ContourTracing(this,(int)lVar10,(int)lVar9,uVar5,b_external);
          }
LAB_001824b5:
          lVar10 = lVar10 + 1;
          uVar4 = (ulong)*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                  field_0xc;
        } while (lVar10 < (long)uVar4);
      }
      lVar9 = lVar9 + 1;
      pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    } while (lVar9 < *(int *)&pMVar6->field_0x8);
  }
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  if (0 < *(int *)&pMVar3->field_0x8) {
    lVar9 = *(long *)&pMVar3->field_0x10;
    lVar7 = **(long **)&pMVar3->field_0x48;
    lVar8 = 0;
    do {
      if (0 < *(int *)&pMVar3->field_0xc) {
        lVar10 = 0;
        do {
          if (*(int *)(lVar9 + lVar10 * 4) == -1) {
            *(undefined4 *)(lVar9 + lVar10 * 4) = 0;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < *(int *)&pMVar3->field_0xc);
      }
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + lVar7;
    } while (lVar8 < *(int *)&pMVar3->field_0x8);
  }
  puVar1 = &(this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void AllScans()
    {
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization

        n_labels_ = 0;
        for (int y = 0; y < img_.rows; y++) {
            const unsigned char* const img_row = img_.ptr<unsigned char>(y);
            unsigned int* const img_labels_out_row = img_labels_.ptr<unsigned int>(y);
            for (int x = 0; x < img_.cols; x++) {

                if (img_row[x] == byF) {
                    // Case 1
                    if (img_labels_out_row[x] == 0 && (x == 0 || img_row[x - 1] != byF)) {
                        n_labels_++;
                        ContourTracing(x, y, n_labels_, true);
                        continue;
                    }
                    // Case 2
                    else if (x < img_.cols - 1 && img_row[x + 1] != byF && img_labels_out_row[x + 1] != -1) {
                        if (img_labels_out_row[x] == 0) {
                            // Current pixel unlabeled
                            // Assing label of left pixel
                            ContourTracing(x, y, img_labels_out_row[x - 1], false);
                        }
                        else {
                            ContourTracing(x, y, img_labels_out_row[x], false);
                        }
                        continue;
                    }
                    // case 3
                    else if (img_labels_out_row[x] == 0) {
                        img_labels_out_row[x] = img_labels_out_row[x - 1];
                    }
                }
            }
        }

        // Reassign to contour background value (0)
        for (int r = 0; r < img_labels_.rows; ++r) {
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            for (int c = 0; c < img_labels_.cols; ++c) {
                if (img_labels_row[c] == -1)
                    img_labels_row[c] = 0;
            }
        }

        n_labels_++; // To count also background label
    }